

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.h
# Opt level: O0

ConvolveParams *
get_conv_params_no_round
          (ConvolveParams *__return_storage_ptr__,int cmp_index,int plane,CONV_BUF_TYPE *dst,
          int dst_stride,int is_compound,int bd)

{
  int iVar1;
  int local_34;
  int intbufrange;
  int is_compound_local;
  int dst_stride_local;
  CONV_BUF_TYPE *dst_local;
  int plane_local;
  int cmp_index_local;
  
  __return_storage_ptr__->is_compound = is_compound;
  __return_storage_ptr__->use_dist_wtd_comp_avg = 0;
  __return_storage_ptr__->round_0 = 3;
  if (is_compound == 0) {
    local_34 = 0xe - __return_storage_ptr__->round_0;
  }
  else {
    local_34 = 7;
  }
  __return_storage_ptr__->round_1 = local_34;
  iVar1 = bd - __return_storage_ptr__->round_0;
  if ((0x10 < iVar1 + 9) &&
     (__return_storage_ptr__->round_0 = iVar1 + -7 + __return_storage_ptr__->round_0,
     is_compound == 0)) {
    __return_storage_ptr__->round_1 = __return_storage_ptr__->round_1 - (iVar1 + -7);
  }
  __return_storage_ptr__->dst = dst;
  __return_storage_ptr__->dst_stride = dst_stride;
  __return_storage_ptr__->plane = plane;
  __return_storage_ptr__->do_average = cmp_index;
  return __return_storage_ptr__;
}

Assistant:

static inline ConvolveParams get_conv_params_no_round(int cmp_index, int plane,
                                                      CONV_BUF_TYPE *dst,
                                                      int dst_stride,
                                                      int is_compound, int bd) {
  ConvolveParams conv_params;
  assert(IMPLIES(cmp_index, is_compound));

  conv_params.is_compound = is_compound;
  conv_params.use_dist_wtd_comp_avg = 0;
  conv_params.round_0 = ROUND0_BITS;
  conv_params.round_1 = is_compound ? COMPOUND_ROUND1_BITS
                                    : 2 * FILTER_BITS - conv_params.round_0;
#if CONFIG_AV1_HIGHBITDEPTH
  const int intbufrange = bd + FILTER_BITS - conv_params.round_0 + 2;
  assert(IMPLIES(bd < 12, intbufrange <= 16));
  if (intbufrange > 16) {
    conv_params.round_0 += intbufrange - 16;
    if (!is_compound) conv_params.round_1 -= intbufrange - 16;
  }
#else
  (void)bd;
#endif  // CONFIG_AV1_HIGHBITDEPTH
  // TODO(yunqing): The following dst should only be valid while
  // is_compound = 1;
  conv_params.dst = dst;
  conv_params.dst_stride = dst_stride;
  conv_params.plane = plane;

  // By default, set do average to 1 if this is the second single prediction
  // in a compound mode.
  conv_params.do_average = cmp_index;
  return conv_params;
}